

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O2

int Mf_ManPrepareCuts(Mf_Cut_t *pCuts,Mf_Man_t *p,int iObj,int fAddUnit)

{
  uint *puVar1;
  uint uVar2;
  uint *puVar3;
  word wVar4;
  uint *puVar5;
  int iVar6;
  int *__dest;
  
  if (p->pLfObjs[iObj].iCutSet == 0) {
    pCuts->Delay = 0;
    pCuts->Flow = 0.0;
    *(undefined4 *)&pCuts->field_0x10 = 0x8000002;
    pCuts->pLeaves[0] = iObj;
    pCuts->Sign = 1L << ((byte)iObj & 0x3f);
    uVar2 = 1;
  }
  else {
    puVar3 = (uint *)Mf_ObjCutSet(p,iObj);
    __dest = pCuts->pLeaves;
    iVar6 = 0;
    puVar1 = puVar3;
    while( true ) {
      puVar5 = puVar1 + 1;
      uVar2 = *puVar3;
      if ((int)uVar2 <= iVar6) break;
      *(undefined8 *)(__dest + -3) = 0;
      uVar2 = *puVar5;
      __dest[-1] = __dest[-1] & 0xf8000000U | uVar2 >> 5;
      __dest[-1] = *puVar5 << 0x1b | uVar2 >> 5;
      uVar2 = *puVar5;
      wVar4 = Mf_CutGetSign((int *)(puVar1 + 2),uVar2 & 0x1f);
      ((Mf_Cut_t *)(__dest + -5))->Sign = wVar4;
      memcpy(__dest,puVar1 + 2,(ulong)((uVar2 & 0x1f) << 2));
      iVar6 = iVar6 + 1;
      puVar1 = puVar5 + (*puVar5 & 0x1f);
      __dest = __dest + 0x10;
    }
    if ((fAddUnit != 0) && (0xfffffff < *(uint *)&pCuts->field_0x10)) {
      *(undefined8 *)(__dest + -3) = 0;
      __dest[-1] = 0x8000002;
      *__dest = iObj;
      ((Mf_Cut_t *)(__dest + -5))->Sign = 1L << ((byte)iObj & 0x3f);
      uVar2 = uVar2 + 1;
    }
  }
  return uVar2;
}

Assistant:

static inline int Mf_ManPrepareCuts( Mf_Cut_t * pCuts, Mf_Man_t * p, int iObj, int fAddUnit )
{
    if ( Mf_ManObj(p, iObj)->iCutSet )
    {
        Mf_Cut_t * pMfCut = pCuts;
        int i, * pCut, * pList = Mf_ObjCutSet(p, iObj);
        Mf_SetForEachCut( pList, pCut, i )
        {
            pMfCut->Delay   = 0;
            pMfCut->Flow    = 0;
            pMfCut->iFunc   = Mf_CutFunc( pCut );
            pMfCut->nLeaves = Mf_CutSize( pCut );
            pMfCut->Sign    = Mf_CutGetSign( pCut+1, Mf_CutSize(pCut) );
            memcpy( pMfCut->pLeaves, pCut+1, sizeof(int) * Mf_CutSize(pCut) );
            pMfCut++;
        }
        if ( fAddUnit && pCuts->nLeaves > 1 )
            return pList[0] + Mf_CutCreateUnit( pMfCut, iObj );
        return pList[0];
    }
    return Mf_CutCreateUnit( pCuts, iObj );
}